

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

BufferWrapper * buffer_wrapped_lookup(ALuint name)

{
  BufferWrapper *pBVar1;
  
  if ((current_context == (ContextWrapper *)0x0) ||
     (name == 0 || current_context->device == (DeviceWrapper *)0x0)) {
LAB_001090e2:
    pBVar1 = (BufferWrapper *)0x0;
  }
  else {
    pBVar1 = (BufferWrapper *)
             (current_context->device->wrapped_buffer_hash + ((ulong)(name & 0xff) - 4));
    do {
      pBVar1 = pBVar1->hash_next;
      if (pBVar1 == (BufferWrapper *)0x0) goto LAB_001090e2;
    } while (pBVar1->name != name);
  }
  return pBVar1;
}

Assistant:

static BufferWrapper *buffer_wrapped_lookup(const ALuint name)
{
    BufferWrapper *retval = NULL;
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    if (device && name) {
        const uint8 hash = hash_alname(name);
        for (retval = device->wrapped_buffer_hash[hash]; retval; retval = retval->hash_next) {
            if (retval->name == name) {
                break;
            }
        }
    }
    return retval;


}